

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunkQueue.c
# Opt level: O0

void destroyQueue(queue *q)

{
  chunk *chunk;
  queue *q_local;
  
  if (q != (queue *)0x0) {
    while (q->size != 0) {
      chunk = front(q);
      destroyChunk(chunk);
      deque(q);
    }
    free(q->elements);
    free(q);
  }
  return;
}

Assistant:

inline void destroyQueue(queue* q)
{
   if (q != NULL)
   {
       while (q->size > 0) //pop any chunks in the queue and free them
       {
           destroyChunk(front(q));
           deque(q);
       }

       free(q->elements); //free the elements chunk*[]
       free(q); //free the q
   }
}